

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O3

void __thiscall Fl_Tree_Item_Array::enlarge(Fl_Tree_Item_Array *this,int count)

{
  int iVar1;
  Fl_Tree_Item **__src;
  int iVar2;
  Fl_Tree_Item **__dest;
  int iVar3;
  
  iVar3 = count + this->_total;
  iVar1 = this->_size;
  if (iVar1 <= iVar3) {
    iVar2 = this->_chunksize;
    if (iVar2 < iVar3 / 0x96) {
      iVar2 = iVar2 * 10;
      this->_chunksize = iVar2;
    }
    __dest = (Fl_Tree_Item **)malloc((long)(iVar1 + iVar2) << 3);
    __src = this->_items;
    if (__src != (Fl_Tree_Item **)0x0) {
      memmove(__dest,__src,(long)iVar1 << 3);
      free(__src);
    }
    this->_items = __dest;
    this->_size = iVar1 + iVar2;
  }
  return;
}

Assistant:

void Fl_Tree_Item_Array::enlarge(int count) {
  int newtotal = _total + count;	// new total
  if ( newtotal >= _size ) {		// more than we have allocated?
    if ( (newtotal/150) > _chunksize ) _chunksize *= 10;
    // Increase size of array
    int newsize = _size + _chunksize;
    Fl_Tree_Item **newitems = (Fl_Tree_Item**)malloc(newsize * sizeof(Fl_Tree_Item*));
    if ( _items ) { 
      // Copy old array -> new, delete old
      memmove(newitems, _items, _size * sizeof(Fl_Tree_Item*));
      free((void*)_items); _items = 0;
    }
    // Adjust items/sizeitems
    _items = newitems;
    _size = newsize;
  }
}